

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

shared_ptr<ot::commissioner::Commissioner>
ot::commissioner::Commissioner::Create(CommissionerHandler *aHandler)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ot::commissioner::Commissioner> sVar2;
  CommissionerHandler local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<ot::commissioner::CommissionerSafe,ot::commissioner::CommissionerHandler&>
            (&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  aHandler->_vptr_CommissionerHandler = (_func_int **)local_18;
  aHandler[1]._vptr_CommissionerHandler = (_func_int **)_Var1._M_pi;
  local_18._vptr_CommissionerHandler = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)aHandler;
  return (shared_ptr<ot::commissioner::Commissioner>)
         sVar2.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Commissioner> Commissioner::Create(CommissionerHandler &aHandler)
{
    return std::make_shared<CommissionerSafe>(aHandler);
}